

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

string * RdbufMove(string *__return_storage_ptr__,string *FileName)

{
  char *local_3a8;
  size_type local_3a0;
  char local_398;
  undefined7 uStack_397;
  undefined8 uStack_390;
  ostringstream Results;
  ifstream ResultReader;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&ResultReader,(string *)FileName,_S_in);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&Results);
  std::ostream::operator<<((ostream *)&Results,local_200);
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_3a8 == &local_398) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_397,local_398);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_390;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_3a8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_397,local_398);
  }
  __return_storage_ptr__->_M_string_length = local_3a0;
  local_3a0 = 0;
  local_398 = '\0';
  local_3a8 = &local_398;
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&Results);
  std::ifstream::~ifstream(&ResultReader);
  return __return_storage_ptr__;
}

Assistant:

std::string RdbufMove(std::string FileName)
{
    std::ifstream ResultReader(FileName);
    std::ostringstream Results;
    Results << ResultReader.rdbuf();
    return std::move(Results.str());
}